

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Validity * __thiscall
capnp::compiler::CompilerMain::verifyRequirements
          (Validity *__return_storage_ptr__,CompilerMain *this,Format format)

{
  bool bVar1;
  StringPtr SVar2;
  ArrayPtr<const_char> local_48;
  char *local_38;
  undefined8 local_30;
  String local_28;
  
  bVar1 = false;
  if ((format - TEXT < 2) &&
     ((this->rootType).super_Schema.raw == (RawBrandedSchema *)(capnp::_::NULL_STRUCT_SCHEMA + 0x48)
     )) {
    SVar2 = toString(this,format);
    local_48.ptr = SVar2.content.ptr;
    local_38 = "format requires schema: ";
    local_30 = 0x18;
    local_48.size_ = SVar2.content.size_ - 1;
    kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              (&local_28,(_ *)&local_38,&local_48,&local_48);
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr = local_28.content.ptr;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ = local_28.content.size_;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
         local_28.content.disposer;
    bVar1 = true;
  }
  (__return_storage_ptr__->errorMessage).ptr.isSet = bVar1;
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity verifyRequirements(Format format) {
    if ((format == Format::TEXT || format == Format::JSON) && rootType == StructSchema()) {
      return kj::str("format requires schema: ", toString(format));
    } else {
      return true;
    }
  }